

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPG.cpp
# Opt level: O1

void __thiscall JPG::discreteCosineTransform(JPG *this)

{
  MCU *pMVar1;
  Block *padVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  Block **ppadVar7;
  uint uVar8;
  double *pdVar9;
  long lVar10;
  uint componentID;
  uint ID;
  uint x;
  long lVar11;
  uint uVar12;
  uint uVar13;
  
  if (this->mcuHeight != 0) {
    uVar6 = 0;
    do {
      uVar3 = this->mcuWidth;
      if (uVar3 != 0) {
        uVar8 = 0;
        do {
          pMVar1 = this->data;
          ID = 1;
          do {
            uVar4 = getVerticalSamplingFrequency(this,ID);
            if (uVar4 != 0) {
              uVar12 = 0;
              do {
                uVar4 = getHorizontalSamplingFrequency(this,ID);
                if (uVar4 != 0) {
                  uVar13 = 0;
                  do {
                    ppadVar7 = MCU::operator[](pMVar1 + (uVar3 * uVar6 + uVar8),ID);
                    padVar2 = *ppadVar7;
                    uVar4 = getHorizontalSamplingFrequency(this,ID);
                    uVar5 = uVar4 * uVar12 + uVar13;
                    pdVar9 = padVar2[uVar5];
                    lVar10 = 0;
                    do {
                      lVar11 = 0;
                      do {
                        pdVar9[lVar11] = pdVar9[lVar11] + -128.0;
                        lVar11 = lVar11 + 1;
                      } while (lVar11 != 8);
                      lVar10 = lVar10 + 1;
                      pdVar9 = pdVar9 + 8;
                    } while (lVar10 != 8);
                    DCT(padVar2 + uVar5);
                    uVar13 = uVar13 + 1;
                    uVar4 = getHorizontalSamplingFrequency(this,ID);
                  } while (uVar13 < uVar4);
                }
                uVar12 = uVar12 + 1;
                uVar4 = getVerticalSamplingFrequency(this,ID);
              } while (uVar12 < uVar4);
            }
            ID = ID + 1;
          } while (ID != 4);
          uVar8 = uVar8 + 1;
          uVar3 = this->mcuWidth;
        } while (uVar8 < uVar3);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < this->mcuHeight);
  }
  return;
}

Assistant:

void JPG::discreteCosineTransform() {
    for (uint i = 0; i < mcuHeight; i++) {
        for (uint j = 0; j < mcuWidth; j++) {
            MCU& currentMCU = data[i * mcuWidth + j];
            //iterate over 每一个component Y, cb cr
            for (uint componentID = 1; componentID <= 3; componentID++) {
                //遍历block
                for(uint ii = 0; ii < getVerticalSamplingFrequency(componentID); ii++) {
                    for(uint jj = 0; jj < getHorizontalSamplingFrequency(componentID); jj++) {
                        Block& currentBlock = currentMCU[componentID][ii * getHorizontalSamplingFrequency(componentID) + jj];
                        //遍历Block every pixels 像素
                        //在进行DCT变化之前把0~255变化到-128~127
                        for(uint y = 0; y < 8; y++) {
                            for(uint x = 0; x < 8; x++) {
                                currentBlock[y * 8 + x] = currentBlock[y * 8 + x] - 128.0;
                            }
                        }
                        DCT(currentBlock); 
                    }
                }             
            }
        }
    }  
}